

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_socket.c
# Opt level: O0

int log_policy_stream_socket_create(log_policy policy,log_policy_ctor ctor)

{
  undefined8 *instance;
  undefined8 in_RSI;
  log_policy in_RDI;
  log_policy_stream_socket_ctor socket_ctor;
  log_policy_stream_socket_data socket_data;
  undefined4 local_4;
  
  instance = (undefined8 *)malloc(8);
  if (instance != (undefined8 *)0x0) {
    *instance = in_RSI;
    log_policy_instantiate(in_RDI,instance,2);
  }
  local_4 = (uint)(instance == (undefined8 *)0x0);
  return local_4;
}

Assistant:

static int log_policy_stream_socket_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_stream_socket_data socket_data = malloc(sizeof(struct log_policy_stream_socket_data_type));

	const log_policy_stream_socket_ctor socket_ctor = ctor;

	if (socket_data == NULL)
	{
		return 1;
	}

/* TODO: open socket */
#define socket_open(ip, port) /* NULL */ (void *)socket_ctor

	socket_data->socket = socket_open(socket_ctor->ip, socket_ctor->port);

	log_policy_instantiate(policy, socket_data, LOG_POLICY_STREAM_SOCKET);

	return 0;
}